

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

string * __thiscall
nlohmann::detail::parse_error::position_string_abi_cxx11_
          (string *__return_storage_ptr__,parse_error *this,position_t *pos)

{
  string local_a8;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  parse_error *local_18;
  position_t *pos_local;
  
  local_18 = this;
  pos_local = (position_t *)__return_storage_ptr__;
  CLI::std::__cxx11::to_string(&local_78,*(long *)&(this->super_exception).m + 1);
  std::operator+(&local_58," at line ",&local_78);
  std::operator+(&local_38,&local_58,", column ");
  CLI::std::__cxx11::to_string(&local_a8,*(unsigned_long *)&(local_18->super_exception).id);
  std::operator+(__return_storage_ptr__,&local_38,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

static std::string position_string(const position_t& pos)
    {
        return " at line " + std::to_string(pos.lines_read + 1) +
               ", column " + std::to_string(pos.chars_read_current_line);
    }